

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *this_00;
  Array<kj::_::HashBucket> *this_01;
  size_t *psVar1;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar2;
  uint uVar3;
  Entry *pEVar4;
  bool bVar5;
  uint uVar6;
  Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
  MVar7;
  RawBrandedSchema *pRVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  Entry *__dest;
  Entry *pEVar12;
  HashBucket *pHVar13;
  Entry *pEVar14;
  ulong uVar15;
  size_t __n;
  Array<kj::_::HashBucket> *other;
  int iVar16;
  size_t in_R8;
  HashBucket *pHVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  RawBrandedSchema *local_58;
  SchemaBindingsPair key;
  
  local_88.pos = local_88.ptr;
  if (bindings.size_ == 0) {
    pRVar8 = &schema->defaultBrand;
  }
  else {
    other = (Array<kj::_::HashBucket> *)&key;
    this_00 = &this->brands;
    key.schema = schema;
    key.scopeBindings = bindings.ptr;
    MVar7 = kj::
            Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
            ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
                      ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                        *)this_00,(SchemaBindingsPair *)other);
    if (MVar7.ptr == (Entry *)0x0) {
      pRVar8 = kj::Arena::allocate<capnp::_::RawBrandedSchema>(&this->arena);
      pRVar8->generic = (RawSchema *)0x0;
      pRVar8->scopes = (Scope *)0x0;
      pRVar8->dependencies = (Dependency *)0x0;
      pRVar8->scopeCount = 0;
      pRVar8->dependencyCount = 0;
      pRVar8->lazyInitializer = (Initializer *)0x0;
      local_68 = key.schema;
      uStack_60 = key.scopeBindings;
      pEVar14 = (this->brands).table.rows.builder.ptr;
      lVar9 = ((long)(this->brands).table.rows.builder.pos - (long)pEVar14) / 0x18;
      pHVar13 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      uVar15 = (long)pHVar13 * 2;
      local_58 = pRVar8;
      if (uVar15 < ((this->brands).table.indexes.erasedCount + lVar9) * 3 + 3) {
        this_01 = &(this->brands).table.indexes.buckets;
        uVar11 = lVar9 * 2 + 2;
        if (uVar11 < uVar15) {
          uVar11 = uVar15;
        }
        oldBuckets.size_ = uVar11;
        oldBuckets.ptr = pHVar13;
        kj::_::rehash((Array<kj::_::HashBucket> *)&local_88,(_ *)this_01->ptr,oldBuckets,in_R8);
        other = (Array<kj::_::HashBucket> *)&local_88;
        kj::Array<kj::_::HashBucket>::operator=(this_01,other);
        kj::Array<kj::_::HashBucket>::~Array((Array<kj::_::HashBucket> *)&local_88);
      }
      bVar5 = kj::
              HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>
              ::Callbacks::hashCode<capnp::(anonymous_namespace)::SchemaBindingsPair&>
                        ((Callbacks *)&local_68,(SchemaBindingsPair *)other);
      uVar6 = kj::_::chooseBucket((uint)bVar5,(uint)(this->brands).table.indexes.buckets.size_);
      pHVar13 = (HashBucket *)0x0;
      do {
        pHVar17 = (this->brands).table.indexes.buckets.ptr + uVar6;
        uVar3 = pHVar17->value;
        if (uVar3 == 1) {
          if (pHVar13 == (HashBucket *)0x0) {
            pHVar13 = pHVar17;
          }
        }
        else {
          if (uVar3 == 0) {
            if (pHVar13 != (HashBucket *)0x0) {
              psVar1 = &(this->brands).table.indexes.erasedCount;
              *psVar1 = *psVar1 - 1;
              pHVar17 = pHVar13;
            }
            *pHVar17 = (HashBucket)(((ulong)bVar5 | lVar9 << 0x20) + 0x200000000);
            pEVar14 = (this->brands).table.rows.builder.pos;
            if (pEVar14 == (this->brands).table.rows.builder.endPtr) {
              pEVar4 = (this_00->table).rows.builder.ptr;
              uVar11 = ((long)pEVar14 - (long)pEVar4) / 0x18;
              uVar15 = 4;
              if (pEVar14 != pEVar4) {
                uVar15 = uVar11 * 2;
              }
              if (uVar15 < uVar11) {
                (this->brands).table.rows.builder.pos = pEVar4 + uVar15;
              }
              __dest = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                          (0x18,0,uVar15,(_func_void_void_ptr *)0x0,
                                           (_func_void_void_ptr *)0x0);
              local_88.ptr = __dest;
              pEVar12 = __dest + uVar15;
              local_88.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
              pEVar14 = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)pEVar14;
              local_88.endPtr = pEVar12;
              pEVar4 = __dest;
              if (__n != 0) {
                memcpy(__dest,pEVar14,__n);
                pEVar4 = local_88.ptr;
              }
              local_88.ptr = pEVar4;
              local_88.pos = (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                              *)((long)__dest + __n);
              kj::
              ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
              ::dispose((ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                         *)this_00);
              (this->brands).table.rows.builder.ptr = __dest;
              (this->brands).table.rows.builder.pos =
                   (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                    *)((long)__dest + __n);
              (this->brands).table.rows.builder.endPtr = pEVar12;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
              local_88.ptr = (Entry *)0x0;
              local_88.pos = (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                              *)0x0;
              local_88.endPtr = (Entry *)0x0;
              kj::
              ArrayBuilder<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
              ::dispose(&local_88);
              pEVar14 = (this->brands).table.rows.builder.pos;
            }
            pEVar14->value = local_58;
            (pEVar14->key).schema = local_68;
            (pEVar14->key).scopeBindings = uStack_60;
            ppRVar2 = &(this->brands).table.rows.builder.pos;
            *ppRVar2 = *ppRVar2 + 1;
            pRVar8->generic = schema;
            pRVar8->scopes = bindings.ptr;
            pRVar8->scopeCount = (uint32_t)bindings.size_;
            pRVar8->lazyInitializer = &(this->brandedInitializer).super_Initializer;
            return pRVar8;
          }
          if (pHVar17->hash == (uint)bVar5) {
            pEVar4 = pEVar14 + (uVar3 - 2);
            auVar18._0_4_ = -(uint)(*(int *)&(pEVar4->key).schema == (int)local_68);
            auVar18._4_4_ = -(uint)(*(int *)((long)&(pEVar4->key).schema + 4) == local_68._4_4_);
            auVar18._8_4_ = -(uint)(*(int *)&(pEVar4->key).scopeBindings == (int)uStack_60);
            auVar18._12_4_ =
                 -(uint)(*(int *)((long)&(pEVar4->key).scopeBindings + 4) == uStack_60._4_4_);
            auVar19._4_4_ = auVar18._0_4_;
            auVar19._0_4_ = auVar18._4_4_;
            auVar19._8_4_ = auVar18._12_4_;
            auVar19._12_4_ = auVar18._8_4_;
            iVar16 = movmskpd((uVar3 - 2) * 0x18,auVar19 & auVar18);
            if (iVar16 == 3) {
              kj::_::throwDuplicateTableRow();
            }
          }
        }
        sVar10 = (ulong)uVar6 + 1;
        uVar6 = (uint)sVar10;
        if (sVar10 == (this->brands).table.indexes.buckets.size_) {
          uVar6 = 0;
        }
      } while( true );
    }
    pRVar8 = (MVar7.ptr)->value;
  }
  return pRVar8;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  // Note that even if `bindings` is empty, we never want to return defaultBrand here because
  // defaultBrand has special status. Normally, the lack of bindings means all parameters are
  // "unspecified", which means their bindings are unknown and should be treated as AnyPointer.
  // But defaultBrand represents a special case where all parameters are still parameters -- they
  // haven't been bound in the first place. defaultBrand is used to represent the unbranded generic
  // type, while a no-binding brand is equivalent to binding all parameters to AnyPointer.

  if (bindings.size() == 0) {
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_MAYBE(existing, brands.find(key)) {
    return *existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }